

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestReferenceCounting::initTextures(TextureViewTestReferenceCounting *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  void *pvVar4;
  pointer p_Var5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_parent_to_id);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_view_to_id);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_view_view_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2723);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_parent_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2727);
  (**(code **)(lVar3 + 0x1380))
            (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x272a);
  uVar10 = 0;
  (**(code **)(lVar3 + 0x14b0))
            (this->m_view_to_id,0xde1,this->m_parent_to_id,0x8058,0,this->m_texture_n_levels,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2730);
  (**(code **)(lVar3 + 0x14b0))
            (this->m_view_view_to_id,0xde1,this->m_view_to_id,0x8058,0,this->m_texture_n_levels,0,1)
  ;
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2736);
  pvVar4 = operator_new__((ulong)(this->m_texture_width * this->m_texture_height * 4));
  p_Var5 = (this->m_mipmap_colors).
           super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_mipmap_colors).
      super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var5) {
    do {
      bVar6 = (byte)uVar10;
      uVar9 = this->m_texture_height >> (bVar6 & 0x1f);
      uVar8 = this->m_texture_width >> (bVar6 & 0x1f);
      if (uVar8 * uVar9 != 0) {
        uVar7 = 0;
        do {
          *(undefined4 *)((long)pvVar4 + uVar7 * 4) = *(undefined4 *)p_Var5[uVar10].rgba;
          uVar7 = uVar7 + 1;
        } while (uVar8 * uVar9 != uVar7);
        uVar8 = this->m_texture_width >> (bVar6 & 0x1f);
        uVar9 = this->m_texture_height >> (bVar6 & 0x1f);
      }
      (**(code **)(lVar3 + 0x13b8))(0xde1,uVar10,0,0,uVar8,uVar9,0x1908,0x1401,pvVar4);
      iVar1 = (**(code **)(lVar3 + 0x800))();
      if (iVar1 != 0) {
        if (pvVar4 != (void *)0x0) {
          operator_delete__(pvVar4);
        }
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"glTexSubImage2D() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x2753);
        pvVar4 = (void *)0x0;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      p_Var5 = (this->m_mipmap_colors).
               super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->m_mipmap_colors).
                                    super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var5 >> 2))
    ;
    if (pvVar4 == (void *)0x0) {
      return;
    }
  }
  operator_delete__(pvVar4);
  return;
}

Assistant:

void TextureViewTestReferenceCounting::initTextures()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate texture IDs */
	gl.genTextures(1, &m_parent_to_id);
	gl.genTextures(1, &m_view_to_id);
	gl.genTextures(1, &m_view_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Set up parent texture object A */
	gl.bindTexture(GL_TEXTURE_2D, m_parent_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");

	/* Set up view B */
	gl.textureView(m_view_to_id, GL_TEXTURE_2D, m_parent_to_id, GL_RGBA8, 0, /* minlevel */
				   m_texture_n_levels, 0,									 /* minlayer */
				   1);														 /* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Set up view C */
	gl.textureView(m_view_view_to_id, GL_TEXTURE_2D, m_view_to_id, GL_RGBA8, 0, /* minlevel */
				   m_texture_n_levels, 0,										/* minlayer */
				   1);															/* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Fill parent texture mip-maps with different static colors */
	unsigned char* texel_data = new unsigned char[m_texture_width * m_texture_height * 4 /* components */];

	for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); n_mipmap++)
	{
		const _norm_vec4&  mipmap_color  = m_mipmap_colors[n_mipmap];
		const unsigned int mipmap_height = m_texture_height >> n_mipmap;
		const unsigned int mipmap_width  = m_texture_width >> n_mipmap;

		for (unsigned int n_texel = 0; n_texel < mipmap_height * mipmap_width; ++n_texel)
		{
			unsigned char* texel_data_ptr = texel_data + n_texel * sizeof(mipmap_color.rgba);

			memcpy(texel_data_ptr, mipmap_color.rgba, sizeof(mipmap_color.rgba));
		} /* for (all relevant mip-map texels) */

		/* Upload new mip-map contents */
		gl.texSubImage2D(GL_TEXTURE_2D, n_mipmap, 0, /* xoffset */
						 0,							 /* yoffset */
						 m_texture_width >> n_mipmap, m_texture_height >> n_mipmap, GL_RGBA, GL_UNSIGNED_BYTE,
						 texel_data);

		if (gl.getError() != GL_NO_ERROR)
		{
			delete[] texel_data;
			texel_data = NULL;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed");
		}
	} /* for (all mip-maps) */

	delete[] texel_data;
	texel_data = NULL;
}